

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::runProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HighsCliqueTable *this_00;
  function<void_(int,_int,_int,_double)> *this_01;
  double *pdVar1;
  pointer puVar2;
  HighsDomain *this_02;
  double dVar3;
  double newLower;
  undefined8 uVar4;
  bool bVar5;
  HighsMipSolverData *pHVar6;
  HighsMipSolver *mipsolver;
  HighsMipSolverData *pHVar7;
  HighsMipSolverData *pHVar8;
  int *piVar9;
  pointer piVar10;
  pointer ppVar11;
  pointer pdVar12;
  bool bVar13;
  HighsInt HVar14;
  HighsInt HVar15;
  int iVar16;
  Result RVar17;
  HighsLp *pHVar18;
  int iVar19;
  ulong uVar20;
  CliqueVar CVar21;
  long lVar22;
  long lVar23;
  pointer ptVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  size_t col;
  long lVar28;
  HighsInt i;
  int iVar29;
  ulong uVar30;
  int *piVar31;
  pointer ppVar32;
  iterator __end2;
  undefined4 uVar33;
  undefined4 uVar34;
  double dVar35;
  HighsInt local_ec;
  int64_t local_e8;
  ulong local_e0;
  HighsPostsolveStack *local_d8;
  ulong local_d0;
  size_t numLiftOpps;
  long local_c0;
  pointer local_b8;
  int local_ac;
  HighsInt local_a8;
  HighsInt local_a4;
  HighsInt local_a0;
  int local_9c;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  binaries;
  HighsRandom random;
  
  local_d8 = postsolve_stack;
  HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0xb);
  this->probingEarlyAbort = false;
  if (this->numDeletedCols + this->numDeletedRows != 0) {
    shrinkProblem(this,local_d8);
  }
  pHVar18 = this->model;
  toCSC(this,&(pHVar18->a_matrix_).value_,&(pHVar18->a_matrix_).index_,&(pHVar18->a_matrix_).start_)
  ;
  pHVar18 = this->model;
  okFromCSC(this,&(pHVar18->a_matrix_).value_,&(pHVar18->a_matrix_).index_,
            &(pHVar18->a_matrix_).start_);
  pHVar6 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HVar14 = numNonzeros(this);
  (pHVar6->cliquetable).maxEntries = HVar14 * 10 + 2000000;
  dVar35 = this->primal_feastol / 1e-14;
  for (uVar30 = 0; pHVar18 = this->model, uVar30 != (uint)pHVar18->num_col_; uVar30 = uVar30 + 1) {
    dVar3 = (pHVar18->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar30];
    newLower = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar30];
    if ((dVar3 < newLower) ||
       ((this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar30] <
        (pHVar18->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar30])) {
      if ((dVar3 < newLower) && (ABS(newLower) <= dVar35)) {
        changeColLower(this,(HighsInt)uVar30,newLower);
      }
      dVar3 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar30];
      if ((ABS(dVar3) <= dVar35) &&
         (dVar3 < (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar30])) {
        changeColUpper(this,(HighsInt)uVar30,dVar3);
      }
    }
  }
  HVar14 = this->numProbed;
  HighsMipSolverData::setupDomainPropagation
            ((this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl);
  pHVar6 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_02 = &pHVar6->domain;
  HighsDomain::propagate(this_02);
  mipsolver = this->mipsolver;
  if ((pHVar6->domain).infeasible_ != false) goto LAB_00304b1c;
  pHVar7 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar7->cliquetable;
  bVar5 = pHVar7->cliquesExtracted;
  pHVar7->cliquesExtracted = true;
  local_a4 = HVar14;
  if (bVar5 == false) {
    HighsCliqueTable::extractCliques(this_00,mipsolver,true);
    mipsolver = this->mipsolver;
    if ((pHVar6->domain).infeasible_ == true) {
LAB_00304b1c:
      HighsMipAnalysis::mipTimerStop(&mipsolver->analysis_,0xb);
      return kPrimalInfeasible;
    }
    pHVar8 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar35 = pHVar8->upper_limit;
    if (dVar35 < INFINITY) {
      pHVar8->upper_limit = dVar35 - this->model->offset_;
      HighsCliqueTable::extractObjCliques(this_00,mipsolver);
      mipsolver = this->mipsolver;
      ((mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit = dVar35;
      if ((pHVar6->domain).infeasible_ == true) goto LAB_00304b1c;
    }
    HighsDomain::propagate(this_02);
    if ((pHVar6->domain).infeasible_ == true) {
      mipsolver = this->mipsolver;
      goto LAB_00304b1c;
    }
  }
  HighsCliqueTable::cleanupFixed(this_00,this_02);
  if ((pHVar6->domain).infeasible_ == true) {
    HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
    return kPrimalInfeasible;
  }
  binaries.
  super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binaries.
  super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binaries.
  super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar8 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if ((pHVar8->cliquetable).numEntries < (pHVar8->cliquetable).maxEntries) {
    std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
    ::reserve(&binaries,(long)this->model->num_col_);
    HighsRandom::initialise(&random,(this->options->super_HighsOptionsStruct).random_seed);
    for (local_ec = 0; local_ec != this->model->num_col_; local_ec = local_ec + 1) {
      bVar13 = HighsDomain::isBinary(this_02,local_ec);
      if (bVar13) {
        HVar14 = HighsCliqueTable::getNumImplications(this_00,local_ec,true);
        HVar15 = HighsCliqueTable::getNumImplications(this_00,local_ec,false);
        lVar22 = (long)HVar15 * (long)HVar14;
        if (4999 < lVar22) {
          lVar22 = 5000;
        }
        numLiftOpps = (size_t)((double)-lVar22 /
                              ((double)(this->numProbes).
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_ec] + 1.0));
        local_9c = HVar15 + HVar14;
        if (99 < local_9c) {
          local_9c = 100;
        }
        local_9c = -local_9c;
        local_a0 = HighsRandom::integer(&random);
        std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>::
        emplace_back<double,int,int,int&>
                  ((vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>
                    *)&binaries,(double *)&numLiftOpps,&local_9c,&local_a0,&local_ec);
      }
    }
    if (binaries.
        super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        binaries.
        super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pdqsort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                ();
      lVar22 = *(long *)&(pHVar6->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl;
      lVar28 = (long)*(pointer *)((long)&(pHVar6->domain).changedcols_ + 8) - lVar22 >> 2;
      iVar19 = this->probingNumDelCol;
      lVar23 = 0;
      while (lVar28 != lVar23) {
        lVar25 = (long)*(int *)(lVar22 + lVar23 * 4);
        lVar23 = lVar23 + 1;
        dVar35 = *(double *)
                  (*(long *)&(pHVar6->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar25 * 8);
        pdVar1 = (double *)
                 (*(long *)&(pHVar6->domain).col_upper_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar25 * 8
                 );
        if ((dVar35 == *pdVar1) && (!NAN(dVar35) && !NAN(*pdVar1))) {
          iVar19 = iVar19 + 1;
          this->probingNumDelCol = iVar19;
        }
      }
      local_a8 = HighsCliqueTable::numCliques(this_00);
      local_ac = (int)(pHVar7->implications).numImplications;
      iVar19 = this->probingNumDelCol;
      local_b8 = (pointer)(((long)*(pointer *)((long)&(pHVar7->implications).substitutions + 8) -
                           *(long *)&(pHVar7->implications).substitutions.
                                     super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                                     ._M_impl) / 0x18);
      local_e8 = (pHVar7->cliquetable).numNeighbourhoodQueries;
      local_e0 = (ulong)((long)*(pointer *)((long)&(pHVar7->cliquetable).substitutions + 8) -
                        *(long *)&(pHVar7->cliquetable).substitutions.
                                  super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                  ._M_impl) >> 3;
      local_d0 = 0;
      uVar27 = 100000;
      if (this->mipsolver->submip != false) {
        uVar27 = 0;
      }
      HVar14 = numNonzeros(this);
      if ((int)uVar27 <= HVar14 * 10) {
        uVar27 = HVar14 * 10;
      }
      uVar20 = (long)this->model->num_row_ * 10;
      uVar30 = 100000;
      if (100000 < uVar20) {
        uVar30 = uVar20;
      }
      numLiftOpps = 0;
      if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing != -1) {
        lVar22 = 0;
        lVar23 = 0;
        for (lVar25 = 0;
            (long)(this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 != lVar25; lVar25 = lVar25 + 1) {
          if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar25] == '\0') {
            lVar22 = lVar22 + 1;
            lVar23 = lVar23 + (ulong)((this->model->integrality_).
                                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar25] ==
                                     kContinuous);
          }
        }
        if ((ulong)(lVar22 * 2) <= (ulong)(lVar23 * 100)) {
          random.state = *(uint64_t *)
                          &(pHVar7->implications).storeLiftingOpportunity.super__Function_base.
                           _M_functor;
          *(HPresolve **)
           &(pHVar7->implications).storeLiftingOpportunity.super__Function_base._M_functor = this;
          *(size_t **)((long)&(pHVar7->implications).storeLiftingOpportunity + 8) = &numLiftOpps;
          *(code **)((long)&(pHVar7->implications).storeLiftingOpportunity + 0x10) =
               std::
               _Function_handler<void_(int,_int,_int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1529:46)>
               ::_M_manager;
          *(code **)((long)&(pHVar7->implications).storeLiftingOpportunity + 0x18) =
               std::
               _Function_handler<void_(int,_int,_int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1529:46)>
               ::_M_invoke;
          std::_Function_base::~_Function_base((_Function_base *)&random);
        }
      }
      local_e0 = (ulong)(uint)((int)local_e0 + (int)local_b8);
      local_e8 = local_e8 + (ulong)uVar27;
      local_b8 = binaries.
                 super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = &(pHVar7->implications).storeLiftingOpportunity;
      for (ptVar24 = binaries.
                     super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ptVar24 != local_b8;
          ptVar24 = ptVar24 + 1) {
        iVar16 = (ptVar24->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                 super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        lVar22 = (long)*(int *)(*(long *)&(pHVar7->cliquetable).colsubstituted.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               (long)iVar16 * 4);
        if (((lVar22 == 0) ||
            (*(long *)&(pHVar7->cliquetable).substitutions.
                       super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                       ._M_impl + lVar22 * 8 == 8)) &&
           (local_c0 = (long)iVar16, bVar13 = HighsDomain::isBinary(this_02,iVar16), bVar13)) {
          iVar16 = (this->model->num_col_ + this->model->num_row_) / 0x14;
          if (iVar16 < 0x3e9) {
            iVar16 = 1000;
          }
          this->probingEarlyAbort = iVar16 < (int)local_e0;
          if ((iVar16 < (int)local_e0) ||
             ((pHVar7->cliquetable).maxEntries <= (pHVar7->cliquetable).numEntries)) break;
          HVar14 = HighsCliqueTable::numCliques(this_00);
          iVar29 = HVar14 - local_a8;
          HVar14 = numNonzeros(this);
          iVar16 = HVar14 * 2;
          if (iVar16 < 0xf4241) {
            iVar16 = 1000000;
          }
          if (iVar16 < iVar29) break;
          iVar29 = (int)(pHVar7->implications).numImplications - local_ac;
          HVar14 = numNonzeros(this);
          iVar16 = HVar14 * 2;
          if (iVar16 < 0xf4241) {
            iVar16 = 1000000;
          }
          if (((iVar16 < iVar29) || (local_e8 < (pHVar7->cliquetable).numNeighbourhoodQueries)) ||
             (this->probingContingent < (long)this->numProbed)) break;
          random.state = random.state & 0xffffffff00000000;
          HVar14 = HighsCliqueTable::numCliques(this_00);
          bVar13 = HighsImplications::runProbing
                             (&pHVar7->implications,(HighsInt)local_c0,(HighsInt *)&random);
          if (bVar13) {
            this->probingContingent = this->probingContingent + (long)(int)random.state;
            HVar15 = HighsCliqueTable::numCliques(this_00);
            iVar29 = HVar15 - HVar14;
            lVar22 = *(long *)&(pHVar6->domain).changedcols_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
            lVar23 = (long)*(pointer *)((long)&(pHVar6->domain).changedcols_ + 8) - lVar22 >> 2;
            iVar16 = this->probingNumDelCol;
            while (lVar23 != lVar28) {
              lVar25 = (long)*(int *)(lVar22 + lVar28 * 4);
              lVar28 = lVar28 + 1;
              dVar35 = *(double *)
                        (*(long *)&(pHVar6->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar25 * 8);
              pdVar1 = (double *)
                       (*(long *)&(pHVar6->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar25 * 8);
              if ((dVar35 == *pdVar1) && (!NAN(dVar35) && !NAN(*pdVar1))) {
                iVar16 = iVar16 + 1;
                this->probingNumDelCol = iVar16;
              }
            }
            iVar26 = 0;
            if (0 < iVar29) {
              iVar26 = iVar29;
            }
            uVar27 = (int)((ulong)((long)*(pointer *)
                                          ((long)&(pHVar7->cliquetable).substitutions + 8) -
                                  *(long *)&(pHVar7->cliquetable).substitutions.
                                            super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                            ._M_impl) >> 3) + (iVar16 - iVar19) +
                     (int)(((long)*(pointer *)((long)&(pHVar7->implications).substitutions + 8) -
                           *(long *)&(pHVar7->implications).substitutions.
                                     super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                                     ._M_impl) / 0x18);
            if ((int)local_e0 < (int)uVar27) {
              this->probingContingent = this->probingContingent + (long)(int)local_e0;
              local_d0 = 0;
              local_e0 = (ulong)uVar27;
              if (this->mipsolver->submip == false) {
                local_e8 = local_e8 + (ulong)(uint)(iVar26 * 1000) +
                           (long)(int)((iVar19 + uVar27) * 100);
              }
            }
            else if ((iVar29 < 1) || (this->mipsolver->submip != false)) {
              local_e8 = local_e8 - (int)local_d0 * 100;
              local_d0 = (ulong)((int)local_d0 + 1);
            }
            else {
              local_e8 = local_e8 + (ulong)(uint)(iVar26 * 1000);
              local_d0 = 0;
            }
            this->numProbed = this->numProbed + 1;
            puVar2 = (this->numProbes).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start + local_c0;
            *puVar2 = *puVar2 + 1;
            if (uVar30 <= numLiftOpps) {
              std::function<void_(int,_int,_int,_double)>::operator=(this_01,(nullptr_t)0x0);
            }
            lVar28 = lVar23;
            if ((pHVar6->domain).infeasible_ == true) {
              HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
              RVar17 = kPrimalInfeasible;
              goto LAB_003055b8;
            }
          }
        }
      }
      HighsCliqueTable::cleanupFixed(this_00,this_02);
      if (bVar5 != false) {
        HighsCliqueTable::extractCliques(this_00,this->mipsolver,false);
      }
      HighsCliqueTable::runCliqueMerging(this_00,this_02);
      piVar9 = *(pointer *)((long)&(pHVar7->cliquetable).deletedrows + 8);
      for (piVar31 = *(int **)&(pHVar7->cliquetable).deletedrows.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar31 != piVar9; piVar31 = piVar31 + 1) {
        if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[*piVar31] == '\0') {
          removeRow(this,*piVar31);
        }
      }
      piVar10 = *(pointer *)
                 &(pHVar7->cliquetable).deletedrows.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl;
      if (*(pointer *)((long)&(pHVar7->cliquetable).deletedrows + 8) != piVar10) {
        *(pointer *)((long)&(pHVar7->cliquetable).deletedrows + 8) = piVar10;
      }
      ppVar32 = *(pointer *)
                 &(pHVar7->cliquetable).cliqueextensions.
                  super__Vector_base<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                  ._M_impl;
      ppVar11 = *(pointer *)((long)&(pHVar7->cliquetable).cliqueextensions + 8);
      uVar30 = (ulong)((long)ppVar11 - (long)ppVar32) >> 3;
      for (; iVar19 = (int)uVar30, ppVar32 != ppVar11; ppVar32 = ppVar32 + 1) {
        iVar16 = ppVar32->first;
        if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar16] == '\0') {
          CVar21 = ppVar32->second;
          uVar27 = 0x3ff00000;
          if (-1 < (int)CVar21) {
            pHVar18 = this->model;
            pdVar12 = (pHVar18->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar12[iVar16] = pdVar12[iVar16] + -1.0;
            pdVar12 = (pHVar18->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar12[iVar16] = pdVar12[iVar16] + -1.0;
            CVar21 = ppVar32->second;
            uVar27 = 0xbff00000;
          }
          addToMatrix(this,iVar16,(uint)CVar21 & 0x7fffffff,(double)((ulong)uVar27 << 0x20));
        }
        else {
          uVar30 = (ulong)(iVar19 - 1);
        }
      }
      ppVar32 = *(pointer *)
                 &(pHVar7->cliquetable).cliqueextensions.
                  super__Vector_base<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                  ._M_impl;
      if (*(pointer *)((long)&(pHVar7->cliquetable).cliqueextensions + 8) != ppVar32) {
        *(pointer *)((long)&(pHVar7->cliquetable).cliqueextensions + 8) = ppVar32;
      }
      for (uVar30 = 0; pHVar18 = this->model, uVar30 != (uint)pHVar18->num_col_; uVar30 = uVar30 + 1
          ) {
        if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar30] == '\0') {
          dVar35 = *(double *)
                    (*(long *)&(pHVar6->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    uVar30 * 8);
          pdVar1 = (pHVar18->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar30;
          HVar14 = (HighsInt)uVar30;
          if (*pdVar1 <= dVar35 && dVar35 != *pdVar1) {
            changeColLower(this,HVar14,dVar35);
            pHVar18 = this->model;
          }
          dVar35 = *(double *)
                    (*(long *)&(pHVar6->domain).col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    uVar30 * 8);
          uVar33 = SUB84(dVar35,0);
          uVar34 = (undefined4)((ulong)dVar35 >> 0x20);
          if (dVar35 < (pHVar18->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar30]) {
            changeColUpper(this,HVar14,dVar35);
            uVar4 = *(undefined8 *)
                     (*(long *)&(pHVar6->domain).col_upper_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     uVar30 * 8);
            uVar33 = (undefined4)uVar4;
            uVar34 = (undefined4)((ulong)uVar4 >> 0x20);
          }
          dVar35 = *(double *)
                    (*(long *)&(pHVar6->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    uVar30 * 8);
          if ((dVar35 == (double)CONCAT44(uVar34,uVar33)) &&
             (!NAN(dVar35) && !NAN((double)CONCAT44(uVar34,uVar33)))) {
            HighsPostsolveStack::removedFixedCol<HighsEmptySlice>
                      (local_d8,HVar14,
                       (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar30],0.0,
                       (HighsMatrixSlice<HighsEmptySlice> *)&random);
            removeFixedCol(this,HVar14);
          }
          RVar17 = checkLimits(this,local_d8);
          if (RVar17 != kOk) goto LAB_003055b8;
        }
      }
      RVar17 = applyConflictGraphSubstitutions(this,local_d8);
      if (RVar17 != kOk) goto LAB_003055b8;
      highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                  "%d probing evaluations: %d deleted rows, %d deleted columns, %d lifted nonzeros\n"
                  ,(ulong)(uint)(this->numProbed - local_a4),(ulong)(uint)this->numDeletedRows,
                  (ulong)(uint)this->numDeletedCols,iVar19);
      if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing != -1) {
        if (((this->numDeletedRows == 0) && (iVar19 == 0 && this->numDeletedCols == 0)) &&
           (RVar17 = liftingForProbing(this,local_d8), RVar17 != kOk)) goto LAB_003055b8;
        std::
        _Hashtable<int,_std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&(this->liftingOpportunities)._M_h);
        std::function<void_(int,_int,_int,_double)>::operator=(this_01,(nullptr_t)0x0);
      }
    }
  }
  HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
  RVar17 = checkLimits(this,local_d8);
LAB_003055b8:
  std::
  _Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>::
  ~_Vector_base(&binaries.
                 super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
               );
  return RVar17;
}

Assistant:

HPresolve::Result HPresolve::runProbing(HighsPostsolveStack& postsolve_stack) {
  mipsolver->analysis_.mipTimerStart(kMipClockProbingPresolve);
  probingEarlyAbort = false;
  if (numDeletedCols + numDeletedRows != 0) shrinkProblem(postsolve_stack);

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);
  okFromCSC(model->a_matrix_.value_, model->a_matrix_.index_,
            model->a_matrix_.start_);

  mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());

  // first tighten all bounds if they have an implied bound that is tighter
  // than their column bound before probing this is not done for continuous
  // columns since it may allow stronger dual presolve and more aggregations
  double hugeBound = primal_feastol / kHighsTiny;
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (model->col_lower_[i] >= implColLower[i] &&
        model->col_upper_[i] <= implColUpper[i])
      continue;

    if (std::abs(implColLower[i]) <= hugeBound) {
      double newLb = implColLower[i];
      if (newLb > model->col_lower_[i]) changeColLower(i, newLb);
    }

    if (std::abs(implColUpper[i]) <= hugeBound) {
      double newUb = implColUpper[i];
      if (newUb < model->col_upper_[i]) changeColUpper(i, newUb);
    }
  }

  HighsInt oldNumProbed = numProbed;

  mipsolver->mipdata_->setupDomainPropagation();
  HighsDomain& domain = mipsolver->mipdata_->domain;

  domain.propagate();
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  HighsImplications& implications = mipsolver->mipdata_->implications;
  bool firstCall = !mipsolver->mipdata_->cliquesExtracted;
  mipsolver->mipdata_->cliquesExtracted = true;

  // extract cliques that are part of the formulation every time before probing
  // after the first call we only add cliques that directly correspond to set
  // packing constraints so that the clique merging step can extend/delete them
  if (firstCall) {
    cliquetable.extractCliques(*mipsolver);
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }

    // during presolve we keep the objective upper bound without the current
    // offset so we need to update it

    if (mipsolver->mipdata_->upper_limit != kHighsInf) {
      double tmpLimit = mipsolver->mipdata_->upper_limit;
      mipsolver->mipdata_->upper_limit = tmpLimit - model->offset_;
      cliquetable.extractObjCliques(*mipsolver);
      mipsolver->mipdata_->upper_limit = tmpLimit;

      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    domain.propagate();
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }
  }

  cliquetable.cleanupFixed(domain);
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }

  // store binary variables in vector with their number of implications on
  // other binaries
  std::vector<std::tuple<int64_t, HighsInt, HighsInt, HighsInt>> binaries;

  if (!mipsolver->mipdata_->cliquetable.isFull()) {
    binaries.reserve(model->num_col_);
    HighsRandom random(options->random_seed);
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (domain.isBinary(i)) {
        HighsInt implicsUp = cliquetable.getNumImplications(i, 1);
        HighsInt implicsDown = cliquetable.getNumImplications(i, 0);
        binaries.emplace_back(
            -std::min(int64_t{5000}, int64_t(implicsUp) * implicsDown) /
                (1.0 + numProbes[i]),
            -std::min(HighsInt{100}, implicsUp + implicsDown), random.integer(),
            i);
      }
    }
  }
  if (!binaries.empty()) {
    // sort variables with many implications on other binaries first
    pdqsort(binaries.begin(), binaries.end());

    size_t numChangedCols = 0;
    while (domain.getChangedCols().size() != numChangedCols) {
      if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
        ++probingNumDelCol;
    }

    HighsInt numCliquesStart = cliquetable.numCliques();
    HighsInt numImplicsStart = implications.getNumImplications();
    HighsInt numDelStart = probingNumDelCol;

    HighsInt numDel = probingNumDelCol - numDelStart +
                      implications.substitutions.size() +
                      cliquetable.getSubstitutions().size();
    int64_t splayContingent =
        cliquetable.numNeighbourhoodQueries +
        std::max(mipsolver->submip ? HighsInt{0} : HighsInt{100000},
                 10 * numNonzeros());
    HighsInt numFail = 0;

    // lambda to check if model has enough continuous variables to perform
    // lifting for probing
    auto modelHasPercentageContVars = [&](size_t percentage) {
      size_t num_cols = 0, num_cont_cols = 0;
      for (size_t col = 0; col < colsize.size(); col++) {
        if (colDeleted[col]) continue;
        num_cols++;
        if (model->integrality_[col] == HighsVarType::kContinuous)
          num_cont_cols++;
      }
      return size_t{100} * num_cont_cols >= percentage * num_cols;
    };

    // collect up to 10 lifting opportunities per row
    const size_t maxNumLiftOpps = std::max(
        size_t{100000}, size_t{10} * static_cast<size_t>(model->num_row_));

    // only search for lifting opportunities if at least 2 percent of the
    // variables in the problem are continuous
    size_t numLiftOpps = 0;
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1 &&
        modelHasPercentageContVars(size_t{2})) {
      // store lifting opportunities
      implications.storeLiftingOpportunity = [&](HighsInt row, HighsInt col,
                                                 HighsInt val, double coef) {
        // find lifting opportunities for row
        auto& htree = liftingOpportunities[row];
        // add element
        auto insertresult = htree.insert_or_get(std::make_pair(col, val), coef);
        assert(insertresult.second);
        numLiftOpps++;
      };
    }

    for (const auto& binvar : binaries) {
      HighsInt i = std::get<3>(binvar);

      if (cliquetable.getSubstitution(i) != nullptr || !domain.isBinary(i))
        continue;

      // when a large percentage of columns have been deleted, stop this round
      // of probing
      // if (numDel > std::max(model->num_col_ * 0.2, 1000.)) break;
      probingEarlyAbort =
          numDel >
          std::max(HighsInt{1000}, (model->num_row_ + model->num_col_) / 20);
      if (probingEarlyAbort) break;

      // break in case of too many new implications to not spent ages in
      // probing
      if (cliquetable.isFull() ||
          cliquetable.numCliques() - numCliquesStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()) ||
          implications.getNumImplications() - numImplicsStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()))
        break;

      // if (numProbed % 10 == 0)
      //   printf(
      //       "numprobed=%d  numDel=%d  newcliques=%d "
      //       "numNeighbourhoodQueries=%ld  "
      //       "splayContingent=%ld\n",
      //       numProbed, numDel, cliquetable.numCliques() - numCliquesStart,
      //       cliquetable.numNeighbourhoodQueries, splayContingent);
      if (cliquetable.numNeighbourhoodQueries > splayContingent) break;

      if (probingContingent - numProbed < 0) break;

      HighsInt numBoundChgs = 0;
      HighsInt numNewCliques = -cliquetable.numCliques();
      const bool probing_result = implications.runProbing(i, numBoundChgs);
      if (!probing_result) continue;
      probingContingent += numBoundChgs;
      numNewCliques += cliquetable.numCliques();
      numNewCliques = std::max(numNewCliques, HighsInt{0});
      while (domain.getChangedCols().size() != numChangedCols) {
        if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
          ++probingNumDelCol;
      }
      HighsInt newNumDel = probingNumDelCol - numDelStart +
                           implications.substitutions.size() +
                           cliquetable.getSubstitutions().size();

      if (newNumDel > numDel) {
        probingContingent += numDel;
        if (!mipsolver->submip) {
          splayContingent += 100 * (newNumDel + numDelStart);
          splayContingent += 1000 * numNewCliques;
        }
        numDel = newNumDel;
        numFail = 0;
      } else if (mipsolver->submip || numNewCliques == 0) {
        splayContingent -= 100 * numFail;
        ++numFail;
      } else {
        splayContingent += 1000 * numNewCliques;
        numFail = 0;
      }

      ++numProbed;
      numProbes[i] += 1;

      // Stop collecting lifting opportunities if maximum is reached
      if (numLiftOpps >= maxNumLiftOpps)
        implications.storeLiftingOpportunity = nullptr;

      // printf("nprobed: %" HIGHSINT_FORMAT ", numCliques: %" HIGHSINT_FORMAT
      // "\n", nprobed,
      //       cliquetable.numCliques());
      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    cliquetable.cleanupFixed(domain);

    if (!firstCall) cliquetable.extractCliques(*mipsolver, false);
    cliquetable.runCliqueMerging(domain);

    // apply changes from probing

    // first delete redundant clique inequalities
    for (HighsInt delrow : cliquetable.getDeletedRows())
      if (!rowDeleted[delrow]) removeRow(delrow);
    cliquetable.getDeletedRows().clear();

    // add nonzeros from clique lifting before removing fixed variables, since
    // this might lead to stronger constraint sides
    auto& extensionvars = cliquetable.getCliqueExtensions();
    HighsInt addednnz = extensionvars.size();
    for (const auto& cliqueextension : extensionvars) {
      if (rowDeleted[cliqueextension.first]) {
        --addednnz;
        continue;
      }
      double val;
      if (cliqueextension.second.val == 0) {
        model->row_lower_[cliqueextension.first] -= 1;
        model->row_upper_[cliqueextension.first] -= 1;
        val = -1.0;
      } else
        val = 1.0;
      addToMatrix(cliqueextension.first, cliqueextension.second.col, val);
    }
    extensionvars.clear();

    // now remove fixed columns and tighten domains
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (colDeleted[i]) continue;
      if (model->col_lower_[i] < domain.col_lower_[i])
        changeColLower(i, domain.col_lower_[i]);
      if (model->col_upper_[i] > domain.col_upper_[i])
        changeColUpper(i, domain.col_upper_[i]);
      if (domain.isFixed(i)) {
        postsolve_stack.removedFixedCol(i, model->col_lower_[i], 0.0,
                                        HighsEmptySlice());
        removeFixedCol(i);
      }
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
    }

    // finally apply substitutions
    HPRESOLVE_CHECKED_CALL(applyConflictGraphSubstitutions(postsolve_stack));

    highsLogDev(options->log_options, HighsLogType::kInfo,
                "%" HIGHSINT_FORMAT " probing evaluations: %" HIGHSINT_FORMAT
                " deleted rows, %" HIGHSINT_FORMAT
                " deleted "
                "columns, %" HIGHSINT_FORMAT " lifted nonzeros\n",
                numProbed - oldNumProbed, numDeletedRows, numDeletedCols,
                addednnz);

    // lifting for probing
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1) {
      // only perform lifting if probing did not modify the problem so far
      if (numDeletedRows == 0 && numDeletedCols == 0 && addednnz == 0)
        HPRESOLVE_CHECKED_CALL(liftingForProbing(postsolve_stack));
      // clear lifting opportunities
      liftingOpportunities.clear();
      implications.storeLiftingOpportunity = nullptr;
    }
  }

  mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
  return checkLimits(postsolve_stack);
}